

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctest.c
# Opt level: O0

wchar_t wchar_ptr_Compare(wchar_t *left,wchar_t *right)

{
  wchar_t *right_local;
  wchar_t *left_local;
  
  if ((left == (wchar_t *)0x0) && (right == (wchar_t *)0x0)) {
    left_local._4_4_ = L'\0';
  }
  else if (left == (wchar_t *)0x0) {
    left_local._4_4_ = L'\xffffffff';
  }
  else if (right == (wchar_t *)0x0) {
    left_local._4_4_ = L'\x01';
  }
  else {
    left_local._4_4_ = wcscmp(left,right);
  }
  return left_local._4_4_;
}

Assistant:

int wchar_ptr_Compare(const wchar_t* left, const wchar_t* right)
{
    if ((left == NULL) &&
        (right == NULL))
    {
        return 0;
    }
    else if (left == NULL)
    {
        return -1;
    }
    else if (right == NULL)
    {
        return 1;
    }
    else
    {
        return wcscmp(left, right);
    }
}